

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O2

void mk_http_request_free_list(mk_http_session *cs,mk_server *server)

{
  mk_list **sr;
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *__mptr;
  mk_list *pmVar3;
  
  pmVar3 = (cs->request_list).next;
  while (pmVar3 != &cs->request_list) {
    pmVar1 = pmVar3->next;
    sr = &pmVar3[-0x3f].next;
    pmVar2 = pmVar3->prev;
    pmVar2->next = pmVar1;
    pmVar1->prev = pmVar2;
    pmVar3->prev = (mk_list *)0x0;
    pmVar3->next = (mk_list *)0x0;
    mk_http_request_free((mk_http_request *)sr,server);
    pmVar3 = pmVar1;
    if ((mk_http_request *)sr != &cs->sr_fixed) {
      free(sr);
    }
  }
  return;
}

Assistant:

void mk_http_request_free_list(struct mk_http_session *cs,
                               struct mk_server *server)
{
    struct mk_list *head, *tmp;
    struct mk_http_request *request;

    /* sr = last node */
    MK_TRACE("[FD %i] Free struct client_session", cs->socket);
    mk_list_foreach_safe(head, tmp, &cs->request_list) {
        request = mk_list_entry(head, struct mk_http_request, _head);
        mk_list_del(&request->_head);

        mk_http_request_free(request, server);
        if (request != &cs->sr_fixed) {
            mk_mem_free(request);
        }
    }
}